

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.h
# Opt level: O2

long __thiscall dlib::drawable::right(drawable *this)

{
  long lVar1;
  auto_mutex M;
  
  M.r = this->m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  lVar1 = (this->rect).r;
  auto_mutex::~auto_mutex(&M);
  return lVar1;
}

Assistant:

long right (
        ) const 
        { 
            auto_mutex M(m); 
            return rect.right(); 
        }